

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall
cmFindPackageCommand::LoadPackageRegistryDir
          (cmFindPackageCommand *this,string *dir,cmSearchPath *outPaths)

{
  bool bVar1;
  unsigned_long uVar2;
  cmFindPackageCommand *this_00;
  ulong dindex;
  cmFindPackageCommandHoldFile holdFile;
  Directory files;
  string fentry;
  string fname;
  ifstream fin;
  cmFindPackageCommandHoldFile local_290;
  Directory local_288;
  string local_280;
  string local_260;
  cmSearchPath *local_240;
  undefined1 local_238 [520];
  
  local_240 = outPaths;
  cmsys::Directory::Directory(&local_288);
  bVar1 = cmsys::Directory::Load(&local_288,dir);
  if (bVar1) {
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    local_260._M_string_length = 0;
    local_260.field_2._M_local_buf[0] = '\0';
    dindex = 0;
    while( true ) {
      uVar2 = cmsys::Directory::GetNumberOfFiles(&local_288);
      if (uVar2 <= dindex) break;
      std::__cxx11::string::_M_assign((string *)&local_260);
      std::__cxx11::string::append((char *)&local_260);
      cmsys::Directory::GetFile(&local_288,dindex);
      std::__cxx11::string::append((char *)&local_260);
      bVar1 = cmsys::SystemTools::FileIsDirectory(&local_260);
      if (!bVar1) {
        local_290.File = local_260._M_dataplus._M_p;
        std::ifstream::ifstream
                  ((cmFindPackageCommand *)local_238,local_260._M_dataplus._M_p,_S_in|_S_bin);
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        local_280._M_string_length = 0;
        local_280.field_2._M_local_buf[0] = '\0';
        if (((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 5) == 0) {
          this_00 = (cmFindPackageCommand *)local_238;
          bVar1 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)local_238,&local_280,(bool *)0x0,-1);
          if (bVar1) {
            bVar1 = CheckPackageRegistryEntry(this_00,&local_280,local_240);
            if (bVar1) {
              local_290.File = (char *)0x0;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        std::ifstream::~ifstream((cmFindPackageCommand *)local_238);
        cmFindPackageCommandHoldFile::~cmFindPackageCommandHoldFile(&local_290);
      }
      dindex = dindex + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,
                      CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                               local_260.field_2._M_local_buf[0]) + 1);
    }
  }
  cmsys::Directory::~Directory(&local_288);
  return;
}

Assistant:

void cmFindPackageCommand::LoadPackageRegistryDir(std::string const& dir,
                                                  cmSearchPath& outPaths)
{
  cmsys::Directory files;
  if (!files.Load(dir)) {
    return;
  }

  std::string fname;
  for (unsigned long i = 0; i < files.GetNumberOfFiles(); ++i) {
    fname = dir;
    fname += "/";
    fname += files.GetFile(i);

    if (!cmSystemTools::FileIsDirectory(fname)) {
      // Hold this file hostage until it behaves.
      cmFindPackageCommandHoldFile holdFile(fname.c_str());

      // Load the file.
      cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
      std::string fentry;
      if (fin && cmSystemTools::GetLineFromStream(fin, fentry) &&
          this->CheckPackageRegistryEntry(fentry, outPaths)) {
        // The file references an existing package, so release it.
        holdFile.Release();
      }
    }
  }

  // TODO: Wipe out the directory if it is empty.
}